

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtMultiSphereShape.cpp
# Opt level: O3

void __thiscall
cbtMultiSphereShape::cbtMultiSphereShape
          (cbtMultiSphereShape *this,cbtVector3 *positions,cbtScalar *radi,int numSpheres)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  cbtScalar *pcVar3;
  cbtVector3 *ptr;
  float *ptr_00;
  undefined8 uVar4;
  uint uVar5;
  cbtVector3 *pcVar6;
  long lVar7;
  float *pfVar8;
  long lVar9;
  ulong uVar10;
  uint uVar11;
  
  cbtConvexInternalAabbCachingShape::cbtConvexInternalAabbCachingShape
            (&this->super_cbtConvexInternalAabbCachingShape);
  uVar11 = 0;
  (this->super_cbtConvexInternalAabbCachingShape).super_cbtConvexInternalShape.super_cbtConvexShape.
  super_cbtCollisionShape._vptr_cbtCollisionShape = (_func_int **)&PTR__cbtMultiSphereShape_00b4ac28
  ;
  (this->m_localPositionArray).m_ownsMemory = true;
  (this->m_localPositionArray).m_data = (cbtVector3 *)0x0;
  (this->m_localPositionArray).m_size = 0;
  (this->m_localPositionArray).m_capacity = 0;
  (this->m_radiArray).m_ownsMemory = true;
  (this->m_radiArray).m_data = (float *)0x0;
  (this->m_radiArray).m_size = 0;
  (this->m_radiArray).m_capacity = 0;
  (this->super_cbtConvexInternalAabbCachingShape).super_cbtConvexInternalShape.super_cbtConvexShape.
  super_cbtCollisionShape.m_shapeType = 9;
  if (0 < numSpheres) {
    pcVar6 = (cbtVector3 *)cbtAlignedAllocInternal((ulong)(uint)numSpheres << 4,0x10);
    lVar7 = (long)(this->m_localPositionArray).m_size;
    if (0 < lVar7) {
      lVar9 = 0;
      do {
        puVar1 = (undefined8 *)((long)((this->m_localPositionArray).m_data)->m_floats + lVar9);
        uVar4 = puVar1[1];
        puVar2 = (undefined8 *)((long)pcVar6->m_floats + lVar9);
        *puVar2 = *puVar1;
        puVar2[1] = uVar4;
        lVar9 = lVar9 + 0x10;
      } while (lVar7 * 0x10 != lVar9);
    }
    ptr = (this->m_localPositionArray).m_data;
    if ((ptr != (cbtVector3 *)0x0) && ((this->m_localPositionArray).m_ownsMemory == true)) {
      cbtAlignedFreeInternal(ptr);
    }
    (this->m_localPositionArray).m_ownsMemory = true;
    (this->m_localPositionArray).m_data = pcVar6;
    (this->m_localPositionArray).m_capacity = numSpheres;
    uVar11 = (this->m_radiArray).m_size;
  }
  (this->m_localPositionArray).m_size = numSpheres;
  if (numSpheres <= (int)uVar11) goto LAB_008d56f3;
  if ((this->m_radiArray).m_capacity < numSpheres) {
    if (numSpheres == 0) {
      pfVar8 = (float *)0x0;
      uVar5 = uVar11;
    }
    else {
      pfVar8 = (float *)cbtAlignedAllocInternal((long)numSpheres * 4,0x10);
      uVar5 = (this->m_radiArray).m_size;
    }
    ptr_00 = (this->m_radiArray).m_data;
    if ((int)uVar5 < 1) {
      if (ptr_00 != (float *)0x0) goto LAB_008d56ad;
    }
    else {
      uVar10 = 0;
      do {
        pfVar8[uVar10] = ptr_00[uVar10];
        uVar10 = uVar10 + 1;
      } while (uVar5 != uVar10);
LAB_008d56ad:
      if ((this->m_radiArray).m_ownsMemory == true) {
        cbtAlignedFreeInternal(ptr_00);
      }
    }
    (this->m_radiArray).m_ownsMemory = true;
    (this->m_radiArray).m_data = pfVar8;
    (this->m_radiArray).m_capacity = numSpheres;
  }
  else {
    pfVar8 = (this->m_radiArray).m_data;
  }
  memset(pfVar8 + (int)uVar11,0,((long)numSpheres - (long)(int)uVar11) * 4);
LAB_008d56f3:
  (this->m_radiArray).m_size = numSpheres;
  if (0 < numSpheres) {
    lVar7 = 0;
    do {
      uVar4 = *(undefined8 *)(positions->m_floats + lVar7 + 2);
      pcVar3 = ((this->m_localPositionArray).m_data)->m_floats + lVar7;
      *(undefined8 *)pcVar3 = *(undefined8 *)(positions->m_floats + lVar7);
      *(undefined8 *)(pcVar3 + 2) = uVar4;
      *(undefined4 *)((long)(this->m_radiArray).m_data + lVar7) =
           *(undefined4 *)((long)radi + lVar7);
      lVar7 = lVar7 + 4;
    } while ((ulong)(uint)numSpheres << 2 != lVar7);
  }
  cbtConvexInternalAabbCachingShape::recalcLocalAabb(&this->super_cbtConvexInternalAabbCachingShape)
  ;
  return;
}

Assistant:

cbtMultiSphereShape::cbtMultiSphereShape(const cbtVector3* positions, const cbtScalar* radi, int numSpheres)
	: cbtConvexInternalAabbCachingShape()
{
	m_shapeType = MULTI_SPHERE_SHAPE_PROXYTYPE;
	//cbtScalar startMargin = cbtScalar(BT_LARGE_FLOAT);

	m_localPositionArray.resize(numSpheres);
	m_radiArray.resize(numSpheres);
	for (int i = 0; i < numSpheres; i++)
	{
		m_localPositionArray[i] = positions[i];
		m_radiArray[i] = radi[i];
	}

	recalcLocalAabb();
}